

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O2

bool __thiscall
Future<void>::Private::LockFreeQueue<Future<void>::Private::ThreadPool::Job>::pop
          (LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this,Job *result)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  Node *pNVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar4 = this->_head;
  do {
    uVar3 = uVar4;
    uVar6 = this->_capacityMask & uVar3;
    uVar1 = this->_queue[uVar6].head;
    if (uVar1 != uVar3) goto LAB_001063ac;
    LOCK();
    uVar4 = this->_head;
    bVar7 = uVar3 == uVar4;
    if (bVar7) {
      this->_head = uVar3 + 1;
      uVar4 = uVar3;
    }
    UNLOCK();
  } while (!bVar7);
  pNVar5 = this->_queue + uVar6;
  pvVar2 = (pNVar5->data).args;
  result->proc = (pNVar5->data).proc;
  result->args = pvVar2;
  LOCK();
  pNVar5->tail = this->_capacity + uVar3;
  UNLOCK();
LAB_001063ac:
  return uVar1 == uVar3;
}

Assistant:

inline bool Future<void>::Private::LockFreeQueue<T>::pop(T &result)
{
  Node *node;
  usize next, head = _head;
  for (;; head = next)
  {
    node = &_queue[head & _capacityMask];
    if (node->head != head)
      return false;
    if ((next = Atomic::compareAndSwap(_head, head, head + 1)) == head)
      break;
  }
  result = node->data;
  (&node->data)->~T();
  Atomic::swap(node->tail, head + _capacity);
  return true;
}